

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

Matrix<double,_3,_4> * __thiscall
math::Matrix<double,_3,_3>::mult<4>
          (Matrix<double,_3,_4> *__return_storage_ptr__,Matrix<double,_3,_3> *this,
          Matrix<double,_3,_4> *rhs)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  InterleavedIter<double,_4> local_30;
  int local_28;
  int local_24;
  int j;
  int i;
  Matrix<double,_3,_4> *rhs_local;
  Matrix<double,_3,_3> *this_local;
  Matrix<double,_3,_4> *ret;
  
  _j = rhs;
  rhs_local = (Matrix<double,_3,_4> *)this;
  this_local = (Matrix<double,_3,_3> *)__return_storage_ptr__;
  Matrix<double,_3,_4>::Matrix(__return_storage_ptr__);
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      iVar2 = local_24 * 3;
      iVar3 = local_24 * 3;
      pdVar1 = Matrix<double,_3,_4>::operator*(_j);
      algo::InterleavedIter<double,_4>::InterleavedIter(&local_30,pdVar1 + local_28);
      dVar4 = std::inner_product<double_const*,math::algo::InterleavedIter<double,4>,double>
                        (this->m + iVar2,this->m + (long)iVar3 + 3,local_30,0.0);
      pdVar1 = Matrix<double,_3,_4>::operator()(__return_storage_ptr__,local_24,local_28);
      *pdVar1 = dVar4;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Matrix<T,N,U>
Matrix<T,N,M>::mult (Matrix<T,M,U> const& rhs) const
{
    typedef algo::InterleavedIter<T,U> RowIter;
    Matrix<T,N,U> ret;
    for (int i = 0; i < ret.rows; ++i)
        for (int j = 0; j < ret.cols; ++j)
            ret(i,j) = std::inner_product(m + M * i,
                m + M * i + M, RowIter(*rhs + j), T(0));
    return ret;
}